

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void __thiscall ImGuiInputTextState::OnKeyPressed(ImGuiInputTextState *this,int key)

{
  STB_TexteditState *state;
  byte bVar1;
  ushort uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  ImFont *pIVar7;
  float fVar8;
  StbUndoRecord *pSVar9;
  ImGuiContext *pIVar10;
  bool bVar11;
  short sVar12;
  int temp;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ImStb *pIVar16;
  ImWchar *pIVar17;
  int n_1;
  uint uVar18;
  int iVar19;
  long lVar20;
  unsigned_short *puVar21;
  long lVar22;
  int n_4;
  int iVar23;
  ImGuiInputTextState *str;
  int *piVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  ImFont *in_R8;
  float *pfVar30;
  uint uVar31;
  int iVar32;
  bool bVar33;
  float fVar34;
  float fVar35;
  ImWchar ch;
  int *local_68;
  ImWchar *local_58;
  float local_4c;
  ImWchar local_48 [6];
  uint local_3c;
  uint local_38;
  uint local_34;
  
  state = &this->Stb;
  bVar1 = (this->Stb).single_line;
LAB_00203708:
  uVar31 = (uint)bVar1;
  switch(key) {
  case 0x200000:
    goto switchD_0020371a_caseD_200000;
  case 0x200001:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      (this->Stb).cursor = (this->Stb).cursor + 1;
      iVar14 = this->CurLenW;
    }
    else {
      ImStb::stb_textedit_move_to_last(this,state);
      iVar14 = this->CurLenW;
      iVar32 = (this->Stb).select_start;
      iVar27 = (this->Stb).select_end;
      if (iVar32 != iVar27) {
        if (iVar14 < iVar32) {
          (this->Stb).select_start = iVar14;
          iVar32 = iVar14;
        }
        if (iVar14 < iVar27) {
          (this->Stb).select_end = iVar14;
          iVar27 = iVar14;
        }
        if (iVar32 == iVar27) {
          state->cursor = iVar32;
        }
      }
    }
    if (iVar14 < state->cursor) goto LAB_00204244;
    goto LAB_002045a3;
  case 0x200002:
  case 0x20000e:
switchD_0020371a_caseD_200002:
    uVar25 = key & 0x400000;
    if ((key & 0xffbfffffU) == 0x20000e) {
      iVar14 = (this->Stb).row_count_per_page;
    }
    else {
      if (bVar1 != 0) {
        key = uVar25 | 0x200000;
        goto LAB_00203708;
      }
      iVar14 = 1;
    }
    uVar29 = (this->Stb).select_start;
    str = (ImGuiInputTextState *)(ulong)uVar29;
    uVar18 = (this->Stb).select_end;
    if (uVar25 == 0) {
      if (uVar29 == uVar18) {
        str = (ImGuiInputTextState *)(ulong)(uint)state->cursor;
      }
      else {
        if ((int)uVar18 < (int)uVar29) {
          (this->Stb).select_start = uVar18;
          str = (ImGuiInputTextState *)(ulong)uVar18;
        }
        (this->Stb).cursor = (int)str;
        (this->Stb).select_end = (int)str;
        (this->Stb).has_preferred_x = '\0';
      }
LAB_00203a65:
      uVar26 = this->CurLenW;
    }
    else {
      if (uVar29 == uVar18) {
        uVar29 = (this->Stb).cursor;
        str = (ImGuiInputTextState *)(ulong)uVar29;
        (this->Stb).select_end = uVar29;
        (this->Stb).select_start = uVar29;
        goto LAB_00203a65;
      }
      (this->Stb).cursor = uVar18;
      uVar26 = this->CurLenW;
      if ((int)uVar26 < (int)uVar29) {
        (this->Stb).select_start = uVar26;
        str = (ImGuiInputTextState *)(ulong)uVar26;
      }
      uVar29 = uVar18;
      if ((int)uVar26 < (int)uVar18) {
        (this->Stb).select_end = uVar26;
        uVar29 = uVar26;
      }
      if ((uint)str == uVar29) {
        state->cursor = (uint)str;
      }
      else {
        str = (ImGuiInputTextState *)(ulong)uVar18;
      }
    }
    if ((int)uVar26 < (int)str) {
      state->cursor = uVar26;
      str = (ImGuiInputTextState *)(ulong)uVar26;
    }
    ImStb::stb_textedit_find_charpos((ImStb *)local_48,(StbFindState *)this,str,uVar31,(int)in_R8);
    if (iVar14 < 1) goto LAB_002045a7;
    pIVar16 = (ImStb *)&(this->Stb).preferred_x;
    if ((this->Stb).has_preferred_x == '\0') {
      pIVar16 = (ImStb *)local_48;
    }
    fVar34 = *(float *)pIVar16;
    iVar32 = 0;
    uVar31 = local_34;
    goto LAB_00203aaf;
  case 0x200003:
  case 0x20000f:
switchD_0020371a_caseD_200003:
    uVar25 = key & 0x400000;
    if ((key & 0xffbfffffU) == 0x20000f) {
      iVar14 = (this->Stb).row_count_per_page;
LAB_0020379a:
      uVar31 = (this->Stb).select_start;
      uVar29 = (this->Stb).select_end;
      if (uVar25 == 0) {
        if (uVar31 == uVar29) goto LAB_002037cf;
        ImStb::stb_textedit_move_to_last(this,state);
        uVar31 = (this->Stb).select_start;
        uVar29 = (this->Stb).select_end;
LAB_00203890:
        uVar18 = this->CurLenW;
        if (uVar31 != uVar29) {
          if ((int)uVar18 < (int)uVar31) {
            (this->Stb).select_start = uVar18;
            uVar31 = uVar18;
          }
          if ((int)uVar18 < (int)uVar29) {
            (this->Stb).select_end = uVar18;
            uVar29 = uVar18;
          }
          if (uVar31 == uVar29) {
            state->cursor = uVar31;
          }
        }
      }
      else {
        if (uVar31 != uVar29) {
          state->cursor = uVar29;
          goto LAB_00203890;
        }
        iVar32 = (this->Stb).cursor;
        (this->Stb).select_end = iVar32;
        (this->Stb).select_start = iVar32;
LAB_002037cf:
        uVar18 = this->CurLenW;
      }
      local_68 = &this->CurLenW;
      uVar31 = state->cursor;
      if ((int)uVar18 < state->cursor) {
        state->cursor = uVar18;
        uVar31 = uVar18;
      }
      ImStb::stb_textedit_find_charpos
                ((ImStb *)local_48,(StbFindState *)this,(ImGuiInputTextState *)(ulong)uVar31,
                 (uint)(this->Stb).single_line,(int)in_R8);
      if (iVar14 < 1) goto LAB_002045a7;
      uVar15 = (ulong)local_38;
      pIVar16 = (ImStb *)&(this->Stb).preferred_x;
      if ((this->Stb).has_preferred_x == '\0') {
        pIVar16 = (ImStb *)local_48;
      }
      local_4c = *(float *)pIVar16;
      iVar32 = 0;
      uVar31 = local_3c;
      goto LAB_00203909;
    }
    if (uVar31 == 0) {
      iVar14 = 1;
      goto LAB_0020379a;
    }
    key = uVar25 | 0x200001;
    goto LAB_00203708;
  case 0x200004:
    uVar25 = this->CurLenW;
    uVar29 = (this->Stb).select_start;
    uVar18 = (this->Stb).select_end;
    uVar26 = uVar29;
    if (uVar29 != uVar18) {
      if ((int)uVar25 < (int)uVar29) {
        (this->Stb).select_start = uVar25;
        uVar29 = uVar25;
      }
      if ((int)uVar25 < (int)uVar18) {
        (this->Stb).select_end = uVar25;
        uVar18 = uVar25;
      }
      uVar26 = uVar18;
      if (uVar29 == uVar18) {
        state->cursor = uVar29;
        uVar26 = uVar29;
      }
    }
    uVar18 = state->cursor;
    if ((int)uVar25 < state->cursor) {
      state->cursor = uVar25;
      uVar18 = uVar25;
    }
    if (uVar29 != uVar26) {
      uVar18 = uVar29;
      if ((int)uVar26 < (int)uVar29) {
        (this->Stb).select_start = uVar26;
        uVar18 = uVar26;
      }
      (this->Stb).cursor = uVar18;
      (this->Stb).select_end = uVar18;
    }
    if (uVar31 != 0) {
      state->cursor = 0;
      goto LAB_002045a3;
    }
    if ((int)uVar18 < 1) goto LAB_002045a3;
    puVar21 = (this->TextW).Data;
    uVar15 = (ulong)uVar18;
    goto LAB_002042c3;
  case 0x200005:
    iVar14 = this->CurLenW;
    iVar32 = (this->Stb).select_start;
    iVar27 = (this->Stb).select_end;
    iVar23 = iVar32;
    if (iVar32 != iVar27) {
      if (iVar14 < iVar32) {
        (this->Stb).select_start = iVar14;
        iVar32 = iVar14;
      }
      if (iVar14 < iVar27) {
        (this->Stb).select_end = iVar14;
        iVar27 = iVar14;
      }
      iVar23 = iVar27;
      if (iVar32 == iVar27) {
        state->cursor = iVar32;
        iVar23 = iVar32;
      }
    }
    iVar27 = state->cursor;
    if (iVar14 < state->cursor) {
      state->cursor = iVar14;
      iVar27 = iVar14;
    }
    if (iVar32 != iVar23) {
      iVar27 = iVar32;
      if (iVar23 < iVar32) {
        (this->Stb).select_start = iVar23;
        iVar27 = iVar23;
      }
      (this->Stb).cursor = iVar27;
      (this->Stb).select_end = iVar27;
    }
    if (uVar31 != 0) {
      state->cursor = iVar14;
      goto LAB_002045a3;
    }
    if (iVar14 <= iVar27) goto LAB_002045a3;
    puVar21 = (this->TextW).Data + iVar27;
    goto LAB_00204301;
  case 0x200006:
    (this->Stb).select_end = 0;
    (this->Stb).cursor = 0;
    (this->Stb).select_start = 0;
    goto LAB_002045a3;
  case 0x200007:
    (this->Stb).cursor = this->CurLenW;
    (this->Stb).select_start = 0;
    (this->Stb).select_end = 0;
    goto LAB_002045a3;
  case 0x200008:
switchD_0020371a_caseD_200008:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar14 = (this->Stb).cursor;
      if (iVar14 < this->CurLenW) {
        ImStb::stb_textedit_delete(this,state,iVar14,1);
      }
      goto LAB_002045a3;
    }
    break;
  case 0x200009:
switchD_0020371a_caseD_200009:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar14 = this->CurLenW;
      iVar32 = (this->Stb).cursor;
      if (iVar14 < iVar32) {
        state->cursor = iVar14;
        iVar32 = iVar14;
      }
      if (0 < iVar32) {
        ImStb::stb_textedit_delete(this,state,iVar32 + -1,1);
        (this->Stb).cursor = (this->Stb).cursor + -1;
      }
      goto LAB_002045a3;
    }
    break;
  case 0x20000a:
    lVar20 = (long)(this->Stb).undostate.undo_point;
    if (lVar20 == 0) goto LAB_002045a3;
    iVar14 = (this->Stb).undostate.undo_rec[lVar20 + -1].where;
    iVar32 = (this->Stb).undostate.undo_rec[lVar20 + -1].insert_length;
    uVar31 = (this->Stb).undostate.undo_rec[lVar20 + -1].delete_length;
    uVar15 = (ulong)(this->Stb).undostate.redo_point;
    iVar27 = (this->Stb).undostate.undo_rec[lVar20 + -1].char_storage;
    (this->Stb).undostate.undo_rec[uVar15 - 1].char_storage = -1;
    (this->Stb).undostate.undo_rec[uVar15 - 1].insert_length = uVar31;
    (this->Stb).undostate.undo_rec[uVar15 - 1].delete_length = iVar32;
    (this->Stb).undostate.undo_rec[uVar15 - 1].where = iVar14;
    if ((ulong)uVar31 == 0) goto LAB_002044de;
    iVar23 = (this->Stb).undostate.undo_char_point;
    if ((int)(iVar23 + uVar31) < 999) {
      iVar19 = (this->Stb).undostate.redo_char_point;
      if (iVar19 < (int)(iVar23 + uVar31)) goto LAB_002043ab;
      goto LAB_0020447f;
    }
    (this->Stb).undostate.undo_rec[uVar15 - 1].insert_length = 0;
    goto LAB_002044cb;
  case 0x20000b:
    lVar20 = (long)(this->Stb).undostate.redo_point;
    if (lVar20 != 99) {
      sVar12 = (this->Stb).undostate.undo_point;
      iVar14 = (this->Stb).undostate.undo_rec[lVar20].where;
      iVar32 = (this->Stb).undostate.undo_rec[lVar20].insert_length;
      uVar31 = (this->Stb).undostate.undo_rec[lVar20].delete_length;
      iVar27 = (this->Stb).undostate.undo_rec[lVar20].char_storage;
      (this->Stb).undostate.undo_rec[sVar12].delete_length = iVar32;
      (this->Stb).undostate.undo_rec[sVar12].insert_length = uVar31;
      (this->Stb).undostate.undo_rec[sVar12].where = iVar14;
      (this->Stb).undostate.undo_rec[sVar12].char_storage = -1;
      if ((ulong)uVar31 != 0) {
        iVar23 = (this->Stb).undostate.undo_char_point;
        if ((this->Stb).undostate.redo_char_point < (int)(iVar23 + uVar31)) {
          pSVar9 = (this->Stb).undostate.undo_rec + sVar12;
          pSVar9->insert_length = 0;
          pSVar9->delete_length = 0;
        }
        else {
          (this->Stb).undostate.undo_rec[sVar12].char_storage = iVar23;
          (this->Stb).undostate.undo_char_point = iVar23 + uVar31;
          if (0 < (int)uVar31) {
            puVar21 = (this->TextW).Data;
            uVar15 = 0;
            do {
              (this->Stb).undostate.undo_char[(long)iVar23 + uVar15] =
                   puVar21[(long)iVar14 + uVar15];
              uVar15 = uVar15 + 1;
            } while (uVar31 != uVar15);
          }
        }
        ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar14,uVar31);
      }
      if (iVar32 != 0) {
        ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar14,(this->Stb).undostate.undo_char + iVar27,iVar32)
        ;
        piVar24 = &(this->Stb).undostate.redo_char_point;
        *piVar24 = *piVar24 + iVar32;
      }
      (this->Stb).cursor = iVar32 + iVar14;
      uVar4 = (this->Stb).undostate.undo_point;
      uVar6 = (this->Stb).undostate.redo_point;
      (this->Stb).undostate.undo_point = uVar4 + 1;
      (this->Stb).undostate.redo_point = uVar6 + 1;
    }
    goto LAB_002045a3;
  case 0x20000c:
    iVar14 = (this->Stb).select_start;
    iVar32 = (this->Stb).select_end;
    bVar33 = SBORROW4(iVar14,iVar32);
    iVar27 = iVar14 - iVar32;
    bVar11 = iVar14 == iVar32;
    if (!bVar11) goto LAB_00204037;
    uVar31 = state->cursor;
    uVar25 = (int)uVar31 >> 0x1f & uVar31;
    goto LAB_0020401a;
  case 0x20000d:
    if ((this->Stb).select_start != (this->Stb).select_end) {
      ImStb::stb_textedit_move_to_last(this,state);
      goto LAB_002045a7;
    }
    uVar31 = ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->Stb).cursor);
    goto LAB_00204332;
  default:
    switch(key) {
    case 0x600000:
      iVar14 = this->CurLenW;
      iVar27 = (this->Stb).select_start;
      iVar32 = (this->Stb).select_end;
      if (iVar27 == iVar32) {
        iVar27 = state->cursor;
LAB_002041ea:
        iVar32 = iVar14;
        if (iVar27 < iVar14) {
          iVar32 = iVar27;
        }
        (this->Stb).select_end = iVar32;
        (this->Stb).select_start = iVar32;
      }
      else {
        if (iVar14 < iVar27) {
          (this->Stb).select_start = iVar14;
          iVar27 = iVar14;
        }
        if (iVar14 < iVar32) {
          (this->Stb).select_end = iVar14;
          iVar32 = iVar14;
        }
        if (iVar27 == iVar32) goto LAB_002041ea;
      }
      if (0 < iVar32) {
        iVar32 = iVar32 + -1;
        (this->Stb).select_end = iVar32;
      }
      (this->Stb).cursor = iVar32;
      goto LAB_002045a3;
    case 0x600001:
      iVar14 = (this->Stb).select_start;
      iVar32 = (this->Stb).select_end;
      if (iVar14 == iVar32) {
        iVar14 = (this->Stb).cursor;
        (this->Stb).select_start = iVar14;
        iVar32 = iVar14;
      }
      iVar27 = iVar32 + 1;
      (this->Stb).select_end = iVar27;
      if (iVar14 != iVar27) {
        iVar23 = this->CurLenW;
        if (iVar23 < iVar14) {
          (this->Stb).select_start = iVar23;
        }
        iVar14 = iVar27;
        if (iVar23 <= iVar32) {
          (this->Stb).select_end = iVar23;
          iVar14 = iVar23;
        }
      }
      (this->Stb).cursor = iVar14;
      goto LAB_002045a3;
    case 0x600002:
    case 0x60000e:
      goto switchD_0020371a_caseD_200002;
    case 0x600003:
    case 0x60000f:
      goto switchD_0020371a_caseD_200003;
    case 0x600004:
      uVar25 = this->CurLenW;
      uVar29 = (this->Stb).select_start;
      uVar18 = (this->Stb).select_end;
      uVar26 = uVar29;
      if (uVar29 != uVar18) {
        if ((int)uVar25 < (int)uVar29) {
          (this->Stb).select_start = uVar25;
          uVar29 = uVar25;
        }
        if ((int)uVar25 < (int)uVar18) {
          (this->Stb).select_end = uVar25;
          uVar18 = uVar25;
        }
        uVar26 = uVar18;
        if (uVar29 == uVar18) {
          state->cursor = uVar29;
          uVar26 = uVar29;
        }
      }
      uVar18 = state->cursor;
      if ((int)uVar25 < state->cursor) {
        state->cursor = uVar25;
        uVar18 = uVar25;
      }
      if (uVar29 == uVar26) {
        (this->Stb).select_start = uVar18;
        uVar26 = uVar18;
      }
      else {
        state->cursor = uVar26;
      }
      uVar25 = 0;
      if (uVar31 != 0) goto LAB_002041ab;
      if ((int)uVar26 < 1) goto LAB_002041b1;
      puVar21 = (this->TextW).Data;
      uVar15 = (ulong)uVar26;
      if (puVar21[(ulong)uVar26 - 1] == 10) goto LAB_002041b1;
      goto LAB_00204295;
    case 0x600005:
      iVar14 = this->CurLenW;
      iVar32 = (this->Stb).select_start;
      iVar27 = (this->Stb).select_end;
      iVar23 = iVar32;
      if (iVar32 != iVar27) {
        if (iVar14 < iVar32) {
          (this->Stb).select_start = iVar14;
          iVar32 = iVar14;
        }
        if (iVar14 < iVar27) {
          (this->Stb).select_end = iVar14;
          iVar27 = iVar14;
        }
        iVar23 = iVar27;
        if (iVar32 == iVar27) {
          state->cursor = iVar32;
          iVar23 = iVar32;
        }
      }
      iVar27 = state->cursor;
      if (iVar14 < state->cursor) {
        state->cursor = iVar14;
        iVar27 = iVar14;
      }
      if (iVar32 == iVar23) {
        (this->Stb).select_start = iVar27;
        iVar23 = iVar27;
      }
      else {
        state->cursor = iVar23;
      }
      iVar32 = iVar14;
      if (uVar31 != 0) goto LAB_00204192;
      if (iVar14 <= iVar23) goto LAB_00204273;
      puVar21 = (this->TextW).Data;
      if (puVar21[iVar23] == 10) goto LAB_00204273;
      puVar21 = puVar21 + iVar23;
      goto LAB_002045d2;
    case 0x600006:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        (this->Stb).select_start = (this->Stb).cursor;
      }
      iVar14 = 0;
      break;
    case 0x600007:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        (this->Stb).select_start = (this->Stb).cursor;
      }
      iVar14 = this->CurLenW;
      break;
    case 0x600008:
      goto switchD_0020371a_caseD_200008;
    case 0x600009:
      goto switchD_0020371a_caseD_200009;
    default:
      uVar31 = 0;
      if (key < 0x200000) {
        uVar31 = key;
      }
      if (((int)uVar31 < 1) || (local_48[0] = (ImWchar)uVar31, uVar31 == 10 && bVar1 != 0))
      goto LAB_002045a7;
      if (((this->Stb).insert_mode == '\0') || ((this->Stb).select_start != (this->Stb).select_end))
      {
LAB_00204345:
        ImStb::stb_textedit_delete_selection(this,state);
        bVar11 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,local_48,1);
        if (!bVar11) goto LAB_002045a7;
        ImStb::stb_text_createundo(&(this->Stb).undostate,(this->Stb).cursor,0,1);
      }
      else {
        iVar14 = (this->Stb).cursor;
        if (this->CurLenW <= iVar14) goto LAB_00204345;
        pIVar17 = ImStb::stb_text_createundo(&(this->Stb).undostate,iVar14,1,1);
        if (pIVar17 != (ImWchar *)0x0) {
          *pIVar17 = (this->TextW).Data[iVar14];
        }
        ImStb::STB_TEXTEDIT_DELETECHARS(this,(this->Stb).cursor,1);
        bVar11 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,local_48,1);
        if (!bVar11) goto LAB_002045a7;
      }
      (this->Stb).cursor = (this->Stb).cursor + 1;
      goto LAB_002045a3;
    case 0x60000c:
      uVar31 = (this->Stb).cursor;
      uVar25 = (this->Stb).select_start;
      if (uVar25 == (this->Stb).select_end) {
        (this->Stb).select_end = uVar31;
        (this->Stb).select_start = uVar31;
        uVar25 = uVar31;
      }
      uVar29 = (int)uVar31 >> 0x1f & uVar31;
      goto LAB_00203ca9;
    case 0x60000d:
      iVar14 = (this->Stb).cursor;
      iVar32 = (this->Stb).select_start;
      if (iVar32 == (this->Stb).select_end) {
        (this->Stb).select_end = iVar14;
        (this->Stb).select_start = iVar14;
        iVar32 = iVar14;
      }
      iVar27 = this->CurLenW;
      iVar23 = iVar14 + 1;
      if (iVar14 + 1 < iVar27) {
        iVar23 = iVar27;
      }
      goto LAB_00203d33;
    }
    (this->Stb).select_end = iVar14;
    (this->Stb).cursor = iVar14;
    goto LAB_002045a3;
  }
  ImStb::stb_textedit_delete_selection(this,state);
  goto LAB_002045a3;
  while (iVar13 = ImStb::is_word_boundary_from_right(this,iVar14), iVar19 = iVar14, iVar13 == 0) {
LAB_00203d33:
    iVar14 = iVar14 + 1;
    iVar19 = iVar23;
    if (iVar27 <= iVar14) break;
  }
  if (iVar27 <= iVar19) {
    iVar19 = iVar27;
  }
  (this->Stb).cursor = iVar19;
  (this->Stb).select_end = iVar19;
  if (iVar32 != iVar19) {
    if (iVar27 < iVar32) {
      (this->Stb).select_start = iVar27;
      iVar32 = iVar27;
    }
    if (iVar32 == iVar19) {
      state->cursor = iVar19;
    }
  }
  goto LAB_002045a7;
  while( true ) {
    uVar31 = uVar31 - 1;
    iVar14 = ImStb::is_word_boundary_from_right(this,uVar31);
    uVar18 = uVar31;
    if (iVar14 != 0) break;
LAB_00203ca9:
    uVar18 = uVar29 - 1;
    if ((int)uVar31 < 1) break;
  }
  uVar31 = 0;
  if (0 < (int)uVar18) {
    uVar31 = uVar18;
  }
  (this->Stb).cursor = uVar31;
  (this->Stb).select_end = uVar31;
  uVar29 = this->CurLenW;
  if (uVar25 != uVar31) {
    uVar18 = uVar25;
    if ((int)uVar29 < (int)uVar25) {
      (this->Stb).select_start = uVar29;
      uVar18 = uVar29;
    }
    uVar26 = uVar31;
    if ((int)uVar29 < (int)uVar31) {
      (this->Stb).select_end = uVar29;
      uVar26 = uVar29;
    }
    uVar25 = uVar31;
    if (uVar18 == uVar26) {
      state->cursor = uVar18;
      uVar25 = uVar18;
    }
  }
  if ((int)uVar29 < (int)uVar25) {
    state->cursor = uVar29;
  }
  goto LAB_002045a7;
  while (iVar23 = iVar23 + 1, iVar32 = iVar23, *puVar21 != 10) {
LAB_002045d2:
    puVar21 = puVar21 + 1;
    iVar32 = iVar14;
    if (iVar14 + -1 == iVar23) break;
  }
LAB_00204192:
  iVar23 = iVar32;
  state->cursor = iVar23;
LAB_00204273:
  (this->Stb).select_end = iVar23;
  goto LAB_002045a3;
  while (uVar28 = uVar15 - 1, lVar20 = uVar15 - 2, uVar15 = uVar28, puVar21[lVar20] != 10) {
LAB_00204295:
    if (uVar15 < 2) goto LAB_002041ab;
  }
  uVar25 = (uint)uVar28;
LAB_002041ab:
  uVar26 = uVar25;
  state->cursor = uVar26;
LAB_002041b1:
  (this->Stb).select_end = uVar26;
  goto LAB_002045a3;
  while( true ) {
    uVar31 = uVar31 - 1;
    iVar14 = ImStb::is_word_boundary_from_right(this,uVar31);
    uVar29 = uVar31;
    if (iVar14 != 0) break;
LAB_0020401a:
    uVar29 = uVar25 - 1;
    if ((int)uVar31 < 1) break;
  }
  uVar31 = 0;
  if (0 < (int)uVar29) {
    uVar31 = uVar29;
  }
LAB_00204332:
  (this->Stb).cursor = uVar31;
  ImStb::stb_textedit_clamp((ImGuiInputTextState *)(ulong)(uint)this->CurLenW,state);
  goto LAB_002045a7;
  while( true ) {
    if (sVar12 < 99) {
      if (-1 < (this->Stb).undostate.undo_rec[0x62].char_storage) {
        iVar23 = (this->Stb).undostate.undo_rec[0x62].insert_length;
        iVar19 = iVar19 + iVar23;
        (this->Stb).undostate.redo_char_point = iVar19;
        pIVar17 = (this->Stb).undostate.undo_char + iVar19;
        memmove(pIVar17,pIVar17 + -(long)iVar23,(long)(999 - iVar19) * 2);
        sVar12 = (this->Stb).undostate.redo_point;
        lVar20 = (long)sVar12;
        if (lVar20 < 0x62) {
          lVar22 = lVar20 + -0x62;
          piVar24 = &(this->Stb).undostate.undo_rec[lVar20].char_storage;
          do {
            if (-1 < *piVar24) {
              *piVar24 = *piVar24 + iVar23;
            }
            piVar24 = piVar24 + 4;
            lVar22 = lVar22 + 1;
          } while (lVar22 != 0);
        }
      }
      lVar20 = (long)sVar12;
      memmove((this->Stb).undostate.undo_rec + lVar20 + 1,(this->Stb).undostate.undo_rec + lVar20,
              lVar20 * -0x10 + 0x620);
      iVar23 = (this->Stb).undostate.undo_char_point;
      uVar25 = *(int *)&(this->Stb).undostate.redo_point + 1;
      uVar15 = (ulong)uVar25;
      (this->Stb).undostate.redo_point = (short)uVar25;
      iVar19 = (this->Stb).undostate.redo_char_point;
    }
    if ((int)(uVar31 + iVar23) <= iVar19) break;
LAB_002043ab:
    sVar12 = (short)uVar15;
    if (sVar12 == 99) goto LAB_002045a3;
  }
  uVar15 = (ulong)(short)uVar15;
LAB_0020447f:
  (this->Stb).undostate.undo_rec[uVar15 - 1].char_storage = iVar19 - uVar31;
  (this->Stb).undostate.redo_char_point = iVar19 - uVar31;
  if (0 < (int)uVar31) {
    puVar21 = (this->TextW).Data;
    uVar15 = 0;
    do {
      *(unsigned_short *)
       ((long)this + uVar15 * 2 + (long)iVar19 * 2 + (long)(int)uVar31 * -2 + 0x69c) =
           puVar21[(long)iVar14 + uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar31 != uVar15);
  }
LAB_002044cb:
  ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar14,uVar31);
LAB_002044de:
  if (iVar32 != 0) {
    ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar14,(this->Stb).undostate.undo_char + iVar27,iVar32);
    piVar24 = &(this->Stb).undostate.undo_char_point;
    *piVar24 = *piVar24 - iVar32;
  }
  (this->Stb).cursor = iVar32 + iVar14;
  uVar3 = (this->Stb).undostate.undo_point;
  uVar5 = (this->Stb).undostate.redo_point;
  (this->Stb).undostate.undo_point = uVar3 + -1;
  (this->Stb).undostate.redo_point = uVar5 + -1;
  goto LAB_002045a3;
  while( true ) {
    state->cursor = iVar27;
    puVar21 = puVar21 + 1;
    if (iVar27 == iVar14) break;
LAB_00204301:
    iVar27 = iVar27 + 1;
    if (*puVar21 == 10) break;
  }
  goto LAB_002045a3;
LAB_00203909:
  do {
    if ((int)uVar15 == 0) break;
    uVar31 = uVar31 + (int)uVar15;
    puVar21 = (this->TextW).Data;
    if (puVar21[(long)(int)uVar31 + -1] != 10) break;
    state->cursor = uVar31;
    local_58 = (ImWchar *)0x0;
    InputTextCalcTextSizeW
              (puVar21 + (int)uVar31,puVar21 + *local_68,&local_58,(ImVec2 *)0x1,SUB81(in_R8,0));
    pIVar10 = GImGui;
    uVar15 = (ulong)((long)local_58 - (long)(puVar21 + (int)uVar31)) >> 1;
    if (0 < (int)(uint)uVar15) {
      puVar21 = (this->TextW).Data;
      iVar27 = (this->Stb).cursor;
      fVar34 = 0.0;
      uVar28 = 0;
      while( true ) {
        uVar2 = puVar21[(long)(int)uVar31 + uVar28];
        in_R8 = (ImFont *)(ulong)uVar2;
        if (uVar2 == 10) break;
        pIVar7 = pIVar10->Font;
        pfVar30 = &pIVar7->FallbackAdvanceX;
        if ((int)(uint)uVar2 < (pIVar7->IndexAdvanceX).Size) {
          pfVar30 = (float *)((ulong)((uint)uVar2 * 4) + (long)(pIVar7->IndexAdvanceX).Data);
        }
        fVar35 = (pIVar10->FontSize / pIVar7->FontSize) * *pfVar30;
        if (((fVar35 == -1.0) && (!NAN(fVar35))) || (fVar34 = fVar34 + fVar35, local_4c < fVar34))
        break;
        uVar29 = iVar27 + 1 + (int)uVar28;
        in_R8 = (ImFont *)(ulong)uVar29;
        state->cursor = uVar29;
        uVar28 = uVar28 + 1;
        if (((uint)uVar15 & 0x7fffffff) == uVar28) break;
      }
    }
    iVar27 = this->CurLenW;
    iVar23 = (this->Stb).select_start;
    iVar19 = (this->Stb).select_end;
    if (iVar23 != iVar19) {
      if (iVar27 < iVar23) {
        (this->Stb).select_start = iVar27;
        iVar23 = iVar27;
      }
      if (iVar27 < iVar19) {
        (this->Stb).select_end = iVar27;
        iVar19 = iVar27;
      }
      if (iVar23 == iVar19) {
        state->cursor = iVar23;
      }
    }
    iVar23 = state->cursor;
    if (iVar27 < state->cursor) {
      state->cursor = iVar27;
      iVar23 = iVar27;
    }
    (this->Stb).has_preferred_x = '\x01';
    (this->Stb).preferred_x = local_4c;
    if (uVar25 != 0) {
      (this->Stb).select_end = iVar23;
    }
    iVar32 = iVar32 + 1;
  } while (iVar32 != iVar14);
  goto LAB_002045a7;
LAB_00203aaf:
  do {
    if (uVar31 == local_3c) break;
    (this->Stb).cursor = uVar31;
    puVar21 = (this->TextW).Data;
    local_58 = (ImWchar *)0x0;
    pIVar17 = puVar21 + (int)uVar31;
    InputTextCalcTextSizeW(pIVar17,puVar21 + this->CurLenW,&local_58,(ImVec2 *)0x1,SUB81(in_R8,0));
    pIVar10 = GImGui;
    uVar29 = (uint)((ulong)((long)local_58 - (long)pIVar17) >> 1);
    if (0 < (int)uVar29) {
      puVar21 = (this->TextW).Data;
      iVar27 = (this->Stb).cursor;
      fVar35 = 0.0;
      uVar15 = 0;
      while (uVar2 = puVar21[(long)(int)uVar31 + uVar15], uVar2 != 10) {
        in_R8 = pIVar10->Font;
        pfVar30 = &in_R8->FallbackAdvanceX;
        if ((int)(uint)uVar2 < (in_R8->IndexAdvanceX).Size) {
          pfVar30 = (float *)((ulong)((uint)uVar2 * 4) + (long)(in_R8->IndexAdvanceX).Data);
        }
        fVar8 = (pIVar10->FontSize / in_R8->FontSize) * *pfVar30;
        if (((fVar8 == -1.0) && (!NAN(fVar8))) || (fVar35 = fVar35 + fVar8, fVar34 < fVar35)) break;
        state->cursor = iVar27 + 1 + (int)uVar15;
        uVar15 = uVar15 + 1;
        if ((uVar29 & 0x7fffffff) == uVar15) break;
      }
    }
    iVar27 = this->CurLenW;
    iVar23 = (this->Stb).select_start;
    iVar19 = (this->Stb).select_end;
    if (iVar23 != iVar19) {
      if (iVar27 < iVar23) {
        (this->Stb).select_start = iVar27;
        iVar23 = iVar27;
      }
      if (iVar27 < iVar19) {
        (this->Stb).select_end = iVar27;
        iVar19 = iVar27;
      }
      if (iVar23 == iVar19) {
        state->cursor = iVar23;
      }
    }
    iVar23 = state->cursor;
    if (iVar27 < state->cursor) {
      state->cursor = iVar27;
      iVar23 = iVar27;
    }
    (this->Stb).has_preferred_x = '\x01';
    (this->Stb).preferred_x = fVar34;
    if (uVar25 != 0) {
      (this->Stb).select_end = iVar23;
    }
    uVar15 = (ulong)(uVar31 - 1);
    if ((int)uVar31 < 1) {
      uVar15 = 0;
    }
    uVar18 = (uint)uVar15;
    uVar29 = uVar18 + 1;
    do {
      uVar26 = (int)uVar18 >> 0x1f & uVar18;
      if ((int)uVar15 < 1) break;
      uVar29 = uVar29 - 1;
      lVar20 = uVar15 - 1;
      uVar15 = uVar15 - 1;
      uVar26 = uVar29;
    } while ((this->TextW).Data[lVar20] != 10);
    iVar32 = iVar32 + 1;
    local_3c = uVar31;
    uVar31 = uVar26;
  } while (iVar32 != iVar14);
  goto LAB_002045a7;
switchD_0020371a_caseD_200000:
  iVar14 = (this->Stb).select_start;
  iVar32 = (this->Stb).select_end;
  bVar33 = SBORROW4(iVar14,iVar32);
  iVar27 = iVar14 - iVar32;
  bVar11 = iVar14 == iVar32;
  if (bVar11) {
    if (0 < state->cursor) {
      iVar14 = state->cursor + -1;
LAB_00204244:
      state->cursor = iVar14;
    }
  }
  else {
LAB_00204037:
    if (!bVar11 && bVar33 == iVar27 < 0) {
      (this->Stb).select_start = iVar32;
      iVar14 = iVar32;
    }
    (this->Stb).cursor = iVar14;
    (this->Stb).select_end = iVar14;
  }
  goto LAB_002045a3;
  while( true ) {
    state->cursor = (int)uVar15 + -1;
    bVar11 = uVar15 < 2;
    uVar15 = uVar15 - 1;
    if (bVar11) break;
LAB_002042c3:
    if (puVar21[uVar15 - 1] == 10) break;
  }
LAB_002045a3:
  (this->Stb).has_preferred_x = '\0';
LAB_002045a7:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiInputTextState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &Stb, key);
    CursorFollow = true;
    CursorAnimReset();
}